

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int modifyPagePointer(MemPage *pPage,Pgno iFrom,Pgno iTo,u8 eType)

{
  u8 uVar1;
  ushort uVar2;
  u32 uVar3;
  int iVar4;
  undefined1 local_58 [8];
  CellInfo info;
  u8 *pCell;
  uint local_28;
  int nCell;
  int i;
  u8 isInitOrig;
  u8 eType_local;
  Pgno iTo_local;
  Pgno iFrom_local;
  MemPage *pPage_local;
  
  if (eType == '\x04') {
    uVar3 = sqlite3Get4byte(pPage->aData);
    if (uVar3 != iFrom) {
      iVar4 = sqlite3CorruptError(0xccb3);
      return iVar4;
    }
    sqlite3Put4byte(pPage->aData,iTo);
  }
  else {
    uVar1 = pPage->isInit;
    btreeInitPage(pPage);
    uVar2 = pPage->nCell;
    for (local_28 = 0; (int)local_28 < (int)(uint)uVar2; local_28 = local_28 + 1) {
      info._24_8_ = pPage->aData +
                    (int)(uint)(pPage->maskPage &
                               CONCAT11(pPage->aCellIdx[(int)(local_28 << 1)],
                                        pPage->aCellIdx[(long)(int)(local_28 << 1) + 1]));
      if (eType == '\x03') {
        btreeParseCellPtr(pPage,(u8 *)info._24_8_,(CellInfo *)local_58);
        if ((((ushort)info.nPayload != 0) &&
            ((u8 *)(info._24_8_ + (long)(int)(uint)(ushort)info.nPayload + 3U) <=
             pPage->aData + (int)(uint)pPage->maskPage)) &&
           (uVar3 = sqlite3Get4byte((u8 *)(info._24_8_ + (ulong)(ushort)info.nPayload)),
           iFrom == uVar3)) {
          sqlite3Put4byte((uchar *)(info._24_8_ + (ulong)(ushort)info.nPayload),iTo);
          break;
        }
      }
      else {
        uVar3 = sqlite3Get4byte((u8 *)info._24_8_);
        if (uVar3 == iFrom) {
          sqlite3Put4byte((uchar *)info._24_8_,iTo);
          break;
        }
      }
    }
    if (local_28 == uVar2) {
      if ((eType != '\x05') ||
         (uVar3 = sqlite3Get4byte(pPage->aData + (int)(pPage->hdrOffset + 8)), uVar3 != iFrom)) {
        iVar4 = sqlite3CorruptError(0xccd5);
        return iVar4;
      }
      sqlite3Put4byte(pPage->aData + (int)(pPage->hdrOffset + 8),iTo);
    }
    pPage->isInit = uVar1;
  }
  return 0;
}

Assistant:

static int modifyPagePointer(MemPage *pPage, Pgno iFrom, Pgno iTo, u8 eType){
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( eType==PTRMAP_OVERFLOW2 ){
    /* The pointer is always the first 4 bytes of the page in this case.  */
    if( get4byte(pPage->aData)!=iFrom ){
      return SQLITE_CORRUPT_BKPT;
    }
    put4byte(pPage->aData, iTo);
  }else{
    u8 isInitOrig = pPage->isInit;
    int i;
    int nCell;

    btreeInitPage(pPage);
    nCell = pPage->nCell;

    for(i=0; i<nCell; i++){
      u8 *pCell = findCell(pPage, i);
      if( eType==PTRMAP_OVERFLOW1 ){
        CellInfo info;
        btreeParseCellPtr(pPage, pCell, &info);
        if( info.iOverflow
         && pCell+info.iOverflow+3<=pPage->aData+pPage->maskPage
         && iFrom==get4byte(&pCell[info.iOverflow])
        ){
          put4byte(&pCell[info.iOverflow], iTo);
          break;
        }
      }else{
        if( get4byte(pCell)==iFrom ){
          put4byte(pCell, iTo);
          break;
        }
      }
    }
  
    if( i==nCell ){
      if( eType!=PTRMAP_BTREE || 
          get4byte(&pPage->aData[pPage->hdrOffset+8])!=iFrom ){
        return SQLITE_CORRUPT_BKPT;
      }
      put4byte(&pPage->aData[pPage->hdrOffset+8], iTo);
    }

    pPage->isInit = isInitOrig;
  }
  return SQLITE_OK;
}